

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

bool __thiscall YAML::Stream::_ReadAheadTo(Stream *this,size_t i)

{
  deque<char,_std::allocator<char>_> *this_00;
  undefined8 in_RAX;
  size_type sVar1;
  undefined8 uStack_28;
  
  this_00 = &this->m_readahead;
  uStack_28 = in_RAX;
  do {
    if (*(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20) != 0) {
LAB_006acb37:
      uStack_28 = CONCAT17(4,(undefined7)uStack_28);
      std::deque<char,_std::allocator<char>_>::emplace_back<char>
                (this_00,(char *)((long)&uStack_28 + 7));
LAB_006acb47:
      sVar1 = std::deque<char,_std::allocator<char>_>::size(this_00);
      return i < sVar1;
    }
    sVar1 = std::deque<char,_std::allocator<char>_>::size(this_00);
    if (i < sVar1) {
      if (*(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20) == 0)
      goto LAB_006acb47;
      goto LAB_006acb37;
    }
    switch(this->m_charSet) {
    case utf8:
      StreamInUtf8(this);
      break;
    case utf16le:
    case utf16be:
      StreamInUtf16(this);
      break;
    case utf32le:
    case utf32be:
      StreamInUtf32(this);
    }
  } while( true );
}

Assistant:

bool Stream::_ReadAheadTo(size_t i) const {
  while (m_input.good() && (m_readahead.size() <= i)) {
    switch (m_charSet) {
      case utf8:
        StreamInUtf8();
        break;
      case utf16le:
        StreamInUtf16();
        break;
      case utf16be:
        StreamInUtf16();
        break;
      case utf32le:
        StreamInUtf32();
        break;
      case utf32be:
        StreamInUtf32();
        break;
    }
  }

  // signal end of stream
  if (!m_input.good())
    m_readahead.push_back(Stream::eof());

  return m_readahead.size() > i;
}